

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

bool __thiscall duckdb::StringValueResult::AddRowInternal(StringValueResult *this)

{
  LinePosition *pLVar1;
  undefined8 *puVar2;
  idx_t iVar3;
  idx_t iVar4;
  idx_t iVar5;
  idx_t iVar6;
  idx_t iVar7;
  bool bVar8;
  const_reference cVar9;
  CSVReaderOptions *pCVar10;
  mapped_type *pmVar11;
  ulong uVar12;
  FullLinePosition *this_00;
  ulong uVar13;
  LinesPerBoundary error_info;
  LinesPerBoundary error_info_00;
  string *psVar14;
  bool first_nl;
  FullLinePosition *local_120;
  CSVReaderOptions *local_118;
  idx_t local_110;
  idx_t local_108;
  LinesPerBoundary lines_per_batch;
  optional_idx local_f0;
  optional_idx local_e8;
  string borked_line;
  CSVError csv_error;
  
  iVar3 = (this->iterator->pos).buffer_idx;
  iVar4 = (this->iterator->pos).buffer_pos;
  pLVar1 = &(this->current_line_position).end;
  if ((this->current_line_position).end.buffer_idx == iVar3) {
    uVar13 = iVar4 - pLVar1->buffer_pos;
  }
  else {
    uVar13 = ((this->current_line_position).end.buffer_size + iVar4) -
             (this->current_line_position).end.buffer_pos;
  }
  iVar5 = this->buffer_size;
  local_120 = &this->current_line_position;
  if (this->store_line_size == true) {
    CSVErrorHandler::NewMaxLineSize(this->error_handler,uVar13);
  }
  (local_120->begin).buffer_idx = (this->current_line_position).end.buffer_idx;
  iVar6 = (this->current_line_position).end.buffer_size;
  (local_120->begin).buffer_pos = pLVar1->buffer_pos;
  (local_120->begin).buffer_size = iVar6;
  (this->current_line_position).end.buffer_pos = iVar4;
  (this->current_line_position).end.buffer_size = iVar5;
  (this->current_line_position).end.buffer_idx = iVar3;
  pCVar10 = ((this->super_ScannerResult).state_machine)->options;
  if ((pCVar10->maximum_line_size).value < uVar13) {
    borked_line._M_dataplus._M_p._0_1_ = 6;
    csv_error.error_message._M_dataplus._M_p = (pointer)0x1;
    LineError::Insert(&this->current_errors,(CSVErrorType *)&borked_line,(idx_t *)&csv_error,
                      &this->chunk_col_id,&(this->super_ScannerResult).last_position,uVar13);
    pCVar10 = ((this->super_ScannerResult).state_machine)->options;
  }
  if (pCVar10->null_padding == false) {
    for (uVar13 = this->cur_col_id; uVar13 < this->number_of_columns; uVar13 = uVar13 + 1) {
      borked_line._M_dataplus._M_p._0_1_ = 2;
      csv_error.error_message._M_dataplus._M_p = (pointer)(uVar13 - 1);
      LineError::Insert(&this->current_errors,(CSVErrorType *)&borked_line,(idx_t *)&csv_error,
                        &this->chunk_col_id,&(this->super_ScannerResult).last_position,0);
    }
  }
  bVar8 = LineError::HandleErrors(&this->current_errors,this);
  if (bVar8) {
    csv_error.error_message._M_dataplus._M_p = (pointer)this->number_of_rows;
    pmVar11 = ::std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->line_positions_per_row,(key_type *)&csv_error);
    iVar3 = (local_120->begin).buffer_size;
    iVar4 = (local_120->begin).buffer_idx;
    iVar5 = (local_120->end).buffer_pos;
    iVar6 = (local_120->end).buffer_size;
    iVar7 = (local_120->end).buffer_idx;
    (pmVar11->begin).buffer_pos = (local_120->begin).buffer_pos;
    (pmVar11->begin).buffer_size = iVar3;
    (pmVar11->begin).buffer_idx = iVar4;
    (pmVar11->end).buffer_pos = iVar5;
    (pmVar11->end).buffer_size = iVar6;
    (pmVar11->end).buffer_idx = iVar7;
  }
  else {
    NullPaddingQuotedNewlineCheck(this);
    this_00 = local_120;
    this->quoted_new_line = false;
    uVar13 = this->cur_col_id;
    uVar12 = (ulong)this->number_of_columns;
    if (uVar13 < uVar12) {
      if (this->null_padding == true) {
        while (uVar13 < uVar12) {
          pCVar10 = ((this->super_ScannerResult).state_machine)->options;
          if (uVar13 < (ulong)*(uint *)((long)&(pCVar10->force_not_null).
                                               super_vector<bool,_std::allocator<bool>_>.
                                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                                               super__Bvector_impl_data._M_finish.
                                               super__Bit_iterator_base + 8) +
                       ((long)(pCVar10->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                       (long)(pCVar10->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) {
            cVar9 = vector<bool,_true>::get<true>(&pCVar10->force_not_null,uVar13);
          }
          else {
            cVar9 = false;
          }
          if ((this->projecting_columns == true) &&
             ((this->projected_columns).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
              super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
              super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
              super__Head_base<0UL,_bool_*,_false>._M_head_impl[this->cur_col_id] == false)) {
            uVar13 = this->cur_col_id + 1;
            this->cur_col_id = uVar13;
          }
          else {
            if (cVar9 == false) {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(this->validity_mask).
                          super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>
                          .
                          super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[this->chunk_col_id]->
                          super_TemplatedValidityMask<unsigned_long>,this->number_of_rows);
            }
            else {
              puVar2 = (undefined8 *)
                       ((long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_start[this->chunk_col_id] +
                       this->number_of_rows * 0x10);
              *puVar2 = 0;
              puVar2[1] = 0;
            }
            uVar13 = this->cur_col_id + 1;
            this->cur_col_id = uVar13;
            this->chunk_col_id = this->chunk_col_id + 1;
          }
          uVar12 = (ulong)this->number_of_columns;
        }
      }
      else {
        bVar8 = CSVReaderOptions::IgnoreErrors(((this->super_ScannerResult).state_machine)->options)
        ;
        if (!bVar8) {
          first_nl = false;
          bVar8 = PrintErrorLine(this);
          FullLinePosition::
          ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
                    (&borked_line,this_00,&first_nl,&this->buffer_handles,bVar8);
          LinesPerBoundary::LinesPerBoundary
                    (&lines_per_batch,(this->iterator->boundary).boundary_idx,*this->lines_read);
          bVar8 = LinePosition::operator==
                            (&this_00->begin,&(this->super_ScannerResult).last_position);
          if (bVar8) {
            iVar3 = this->cur_col_id;
            local_118 = ((this->super_ScannerResult).state_machine)->options;
            local_108 = lines_per_batch.boundary_idx;
            local_110 = lines_per_batch.lines_in_batch;
            iVar4 = this->requested_size;
            uVar13 = (ulong)first_nl;
            iVar5 = (this->current_line_position).begin.buffer_idx;
            iVar6 = (this->current_line_position).begin.buffer_pos;
            psVar14 = (string *)0x18a4049;
            optional_idx::optional_idx
                      (&local_e8,
                       (this->super_ScannerResult).last_position.buffer_pos + uVar13 +
                       (this->super_ScannerResult).last_position.buffer_idx * iVar4);
            error_info.lines_in_batch = (idx_t)&borked_line;
            error_info.boundary_idx = local_110;
            CSVError::IncorrectColumnAmountError
                      (&csv_error,(CSVError *)local_118,(CSVReaderOptions *)(iVar3 - 1),local_108,
                       error_info,(string *)(iVar5 * iVar4 + iVar6 + uVar13),local_e8.index,
                       (optional_idx)&this->path,psVar14);
            CSVErrorHandler::Error(this->error_handler,&csv_error,false);
          }
          else {
            iVar3 = this->cur_col_id;
            local_118 = ((this->super_ScannerResult).state_machine)->options;
            local_108 = lines_per_batch.boundary_idx;
            local_110 = lines_per_batch.lines_in_batch;
            iVar4 = this->requested_size;
            uVar13 = (ulong)first_nl;
            iVar5 = (this->current_line_position).begin.buffer_idx;
            iVar6 = (this->current_line_position).begin.buffer_pos;
            psVar14 = (string *)0x18a4101;
            optional_idx::optional_idx
                      (&local_f0,
                       (this->super_ScannerResult).last_position.buffer_idx * iVar4 +
                       (this->super_ScannerResult).last_position.buffer_pos);
            error_info_00.lines_in_batch = (idx_t)&borked_line;
            error_info_00.boundary_idx = local_110;
            CSVError::IncorrectColumnAmountError
                      (&csv_error,(CSVError *)local_118,(CSVReaderOptions *)(iVar3 - 1),local_108,
                       error_info_00,(string *)(iVar5 * iVar4 + iVar6 + uVar13),local_f0.index,
                       (optional_idx)&this->path,psVar14);
            CSVErrorHandler::Error(this->error_handler,&csv_error,false);
          }
          CSVError::~CSVError(&csv_error);
          this_00 = local_120;
          ::std::__cxx11::string::~string((string *)&borked_line);
        }
        RemoveLastLine(this);
      }
    }
    csv_error.error_message._M_dataplus._M_p = (pointer)this->number_of_rows;
    pmVar11 = ::std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->line_positions_per_row,(key_type *)&csv_error);
    iVar3 = (this_00->begin).buffer_size;
    iVar4 = (this_00->begin).buffer_idx;
    iVar5 = (this_00->end).buffer_pos;
    iVar6 = (this_00->end).buffer_size;
    iVar7 = (this_00->end).buffer_idx;
    (pmVar11->begin).buffer_pos = (this_00->begin).buffer_pos;
    (pmVar11->begin).buffer_size = iVar3;
    (pmVar11->begin).buffer_idx = iVar4;
    (pmVar11->end).buffer_pos = iVar5;
    (pmVar11->end).buffer_size = iVar6;
    (pmVar11->end).buffer_idx = iVar7;
    this->cur_col_id = 0;
    this->chunk_col_id = 0;
  }
  uVar13 = this->number_of_rows + 1;
  this->number_of_rows = uVar13;
  return (this->super_ScannerResult).result_size <= uVar13;
}

Assistant:

bool StringValueResult::AddRowInternal() {
	LinePosition current_line_start = {iterator.pos.buffer_idx, iterator.pos.buffer_pos, buffer_size};
	idx_t current_line_size = current_line_start - current_line_position.end;
	if (store_line_size) {
		error_handler.NewMaxLineSize(current_line_size);
	}
	current_line_position.begin = current_line_position.end;
	current_line_position.end = current_line_start;
	if (current_line_size > state_machine.options.maximum_line_size.GetValue()) {
		current_errors.Insert(MAXIMUM_LINE_SIZE, 1, chunk_col_id, last_position, current_line_size);
	}
	if (!state_machine.options.null_padding) {
		for (idx_t col_idx = cur_col_id; col_idx < number_of_columns; col_idx++) {
			current_errors.Insert(TOO_FEW_COLUMNS, col_idx - 1, chunk_col_id, last_position);
		}
	}

	if (current_errors.HandleErrors(*this)) {
		D_ASSERT(buffer_handles.find(current_line_position.begin.buffer_idx) != buffer_handles.end());
		D_ASSERT(buffer_handles.find(current_line_position.end.buffer_idx) != buffer_handles.end());
		line_positions_per_row[static_cast<idx_t>(number_of_rows)] = current_line_position;
		number_of_rows++;
		if (static_cast<idx_t>(number_of_rows) >= result_size) {
			// We have a full chunk
			return true;
		}
		return false;
	}
	NullPaddingQuotedNewlineCheck();
	quoted_new_line = false;
	// We need to check if we are getting the correct number of columns here.
	// If columns are correct, we add it, and that's it.
	if (cur_col_id < number_of_columns) {
		// We have too few columns:
		if (null_padding) {
			while (cur_col_id < number_of_columns) {
				bool empty = false;
				if (cur_col_id < state_machine.options.force_not_null.size()) {
					empty = state_machine.options.force_not_null[cur_col_id];
				}
				if (projecting_columns) {
					if (!projected_columns[cur_col_id]) {
						cur_col_id++;
						continue;
					}
				}
				if (empty) {
					static_cast<string_t *>(vector_ptr[chunk_col_id])[number_of_rows] = string_t();
				} else {
					validity_mask[chunk_col_id]->SetInvalid(static_cast<idx_t>(number_of_rows));
				}
				cur_col_id++;
				chunk_col_id++;
			}
		} else {
			// If we are not null-padding this is an error
			if (!state_machine.options.IgnoreErrors()) {
				bool first_nl = false;
				auto borked_line =
				    current_line_position.ReconstructCurrentLine(first_nl, buffer_handles, PrintErrorLine());
				LinesPerBoundary lines_per_batch(iterator.GetBoundaryIdx(), lines_read);
				if (current_line_position.begin == last_position) {
					auto csv_error = CSVError::IncorrectColumnAmountError(
					    state_machine.options, cur_col_id - 1, lines_per_batch, borked_line,
					    current_line_position.begin.GetGlobalPosition(requested_size, first_nl),
					    last_position.GetGlobalPosition(requested_size, first_nl), path);
					error_handler.Error(csv_error);
				} else {
					auto csv_error = CSVError::IncorrectColumnAmountError(
					    state_machine.options, cur_col_id - 1, lines_per_batch, borked_line,
					    current_line_position.begin.GetGlobalPosition(requested_size, first_nl),
					    last_position.GetGlobalPosition(requested_size), path);
					error_handler.Error(csv_error);
				}
			}
			// If we are here we ignore_errors, so we delete this line
			RemoveLastLine();
		}
	}
	D_ASSERT(buffer_handles.find(current_line_position.begin.buffer_idx) != buffer_handles.end());
	D_ASSERT(buffer_handles.find(current_line_position.end.buffer_idx) != buffer_handles.end());
	line_positions_per_row[static_cast<idx_t>(number_of_rows)] = current_line_position;
	cur_col_id = 0;
	chunk_col_id = 0;
	number_of_rows++;
	if (static_cast<idx_t>(number_of_rows) >= result_size) {
		// We have a full chunk
		return true;
	}
	return false;
}